

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall
higan::Channel::Channel(Channel *this,EventLoop *loop,string *connection_name,int fd)

{
  int fd_local;
  string *connection_name_local;
  EventLoop *loop_local;
  Channel *this_local;
  
  this->loop_ = loop;
  std::__cxx11::string::string((string *)&this->connection_name_,(string *)connection_name);
  this->fd_ = fd;
  this->connecting_ = true;
  this->register_readable_ = false;
  this->register_writable_ = false;
  this->channel_readable_ = false;
  this->channel_writable_ = false;
  this->channel_error_ = false;
  std::function<void_()>::function(&this->error_callback_);
  std::function<void_()>::function(&this->writable_callback_);
  std::function<void_()>::function(&this->readable_callback_);
  this->channel_status_ = CHANNEL_NOT_ADDED;
  return;
}

Assistant:

Channel::Channel(EventLoop* loop, const std::string& connection_name,int fd):
		loop_(loop),
		connection_name_(connection_name),
		fd_(fd),
		connecting_(true),
		register_readable_(false),
		register_writable_(false),
		channel_readable_(false),
		channel_writable_(false),
		channel_error_(false),
		channel_status_(CHANNEL_NOT_ADDED)
{

}